

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi00.hpp
# Opt level: O1

size_t __thiscall
websocketpp::processor::hybi00<websocketpp::config::asio>::consume
          (hybi00<websocketpp::config::asio> *this,uint8_t *buf,size_t len,error_code *ec)

{
  uint8_t *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uchar *puVar4;
  state sVar5;
  error_category *peVar6;
  uchar *puVar7;
  uchar *puVar8;
  string *psVar9;
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  local_58;
  uint8_t *local_40;
  uchar *local_38;
  
  peVar6 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar6;
  if (len == 0) {
    puVar8 = (uchar *)0x0;
  }
  else {
    local_38 = buf + len;
    local_40 = &this->msg_ftr;
    puVar8 = (uchar *)0x0;
    do {
      puVar4 = local_38;
      if (this->m_state == PAYLOAD) {
        puVar1 = buf + (long)puVar8;
        puVar7 = std::
                 __find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                           (puVar1,local_38,local_40);
        psVar9 = &((this->m_msg_ptr).
                   super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_payload;
        std::__cxx11::string::reserve((ulong)psVar9);
        std::__cxx11::string::append((char *)psVar9,(ulong)puVar1);
        puVar8 = puVar7 + ((long)puVar8 - (long)puVar1);
        if (puVar7 != puVar4) {
          puVar8 = puVar8 + 1;
          sVar5 = READY;
          goto LAB_001a9b90;
        }
      }
      else {
        if (this->m_state != HEADER) {
          return (size_t)puVar8;
        }
        if (buf[(long)puVar8] == this->msg_hdr) {
          message_buffer::alloc::
          con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
          ::get_message(&local_58,
                        (value)(this->m_msg_manager).
                               super___shared_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,1);
          _Var3._M_pi = local_58.
                        super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                        ._M_weak_this.
                        super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          peVar2 = local_58.
                   super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                   ._M_weak_this.
                   super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          local_58.
          super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
          ._M_weak_this.
          super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_58.
          super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
          ._M_weak_this.
          super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (this->m_msg_ptr).
                    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (this->m_msg_ptr).
          super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)peVar2;
          (this->m_msg_ptr).
          super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Var3._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (local_58.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.
                       super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                       ._M_weak_this.
                       super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          puVar8 = puVar8 + 1;
          sVar5 = PAYLOAD;
          if ((this->m_msg_ptr).
              super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) goto LAB_001a9b90;
          if (websocketpp::error::get_category()::instance == '\0') {
            consume();
          }
          ec->_M_value = 8;
          peVar6 = (error_category *)&websocketpp::error::get_category()::instance;
        }
        else {
          if (error::get_processor_category()::instance == '\0') {
            consume();
          }
          ec->_M_value = 3;
          peVar6 = (error_category *)&error::get_processor_category()::instance;
        }
        ec->_M_cat = peVar6;
        sVar5 = FATAL_ERROR;
LAB_001a9b90:
        this->m_state = sVar5;
      }
    } while (puVar8 < len);
  }
  return (size_t)puVar8;
}

Assistant:

size_t consume(uint8_t * buf, size_t len, lib::error_code & ec) {
        // if in state header we are expecting a 0x00 byte, if we don't get one
        // it is a fatal error
        size_t p = 0; // bytes processed
        size_t l = 0;

        ec = lib::error_code();

        while (p < len) {
            if (m_state == HEADER) {
                if (buf[p] == msg_hdr) {
                    p++;
                    m_msg_ptr = m_msg_manager->get_message(frame::opcode::text,1);

                    if (!m_msg_ptr) {
                        ec = make_error_code(websocketpp::error::no_incoming_buffers);
                        m_state = FATAL_ERROR;
                    } else {
                        m_state = PAYLOAD;
                    }
                } else {
                    ec = make_error_code(error::protocol_violation);
                    m_state = FATAL_ERROR;
                }
            } else if (m_state == PAYLOAD) {
                uint8_t *it = std::find(buf+p,buf+len,msg_ftr);

                // 0    1    2    3    4    5
                // 0x00 0x23 0x23 0x23 0xff 0xXX

                // Copy payload bytes into message
                l = static_cast<size_t>(it-(buf+p));
                m_msg_ptr->append_payload(buf+p,l);
                p += l;

                if (it != buf+len) {
                    // message is done, copy it and the trailing
                    p++;
                    // TODO: validation
                    m_state = READY;
                }
            } else {
                // TODO
                break;
            }
        }
        // If we get one, we create a new message and move to application state

        // if in state application we are copying bytes into the output message
        // and validating them for UTF8 until we hit a 0xff byte. Once we hit
        // 0x00, the message is complete and is dispatched. Then we go back to
        // header state.

        //ec = make_error_code(error::not_implemented);
        return p;
    }